

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  code *pcVar1;
  ze_device_handle_t p_Var2;
  undefined8 uVar3;
  undefined1 local_88 [64];
  code *local_48;
  ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle;
  dditable_t *dditable;
  void **ppvStack_30;
  ze_result_t result;
  void **pptr_local;
  undefined8 uStack_20;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnOpenIpcHandle = *(ze_pfnMemOpenIpcHandle_t *)(hContext + 8);
  pcVar1 = *(code **)(pfnOpenIpcHandle + 1000);
  if (pcVar1 == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    p_Var2 = *(ze_device_handle_t *)hContext;
    uVar3 = *(undefined8 *)hDevice;
    local_48 = pcVar1;
    ppvStack_30 = pptr;
    pptr_local._4_4_ = flags;
    uStack_20 = uVar3;
    hDevice_local = p_Var2;
    memcpy(local_88,&handle,0x40);
    hContext_local._4_4_ = (*pcVar1)(p_Var2,uVar3,pptr_local._4_4_,ppvStack_30);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_context_object_t*>( hContext )->dditable;
        auto pfnOpenIpcHandle = dditable->ze.Mem.pfnOpenIpcHandle;
        if( nullptr == pfnOpenIpcHandle )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<ze_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<ze_device_object_t*>( hDevice )->handle;

        // forward to device-driver
        result = pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );

        return result;
    }